

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O2

bool __thiscall DOMTest::testUtilFunctions(DOMTest *this)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  XMLSize_t XVar7;
  XMLSize_t XVar8;
  XMLByte *pXVar9;
  size_t sVar10;
  XMLCh *pXVar11;
  long lVar12;
  TranscodeToStr local_2a0 [32];
  CMStateSet setT2;
  XMLCh uval [2];
  XMLCh aval [2];
  char *uc;
  char *ac;
  char *empty;
  CMStateSetEnumerator enumT;
  CMStateSet setT;
  char *bytes2;
  char *bytes;
  char *uc4;
  XMLCh *uc2;
  XMLCh *ac2;
  XMLCh *empty2;
  XMLCh uc3 [2];
  XMLCh one [2];
  XMLCh two [3];
  CMStateSet setT4;
  CMStateSet setT3;
  CMStateSetEnumerator enumT2c;
  CMStateSetEnumerator enumT2b;
  CMStateSetEnumerator enumT2a;
  CMStateSetEnumerator enumT2;
  XMLCh xmlStr [7];
  XMLCh xmlStr2 [12];
  XMLCh buffer [100];
  
  xercesc_4_0::XMLString::transcode
            (" xyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XMLString::isWSReplaced(tempStr);
  if (cVar2 == '\0') {
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x1655);
  }
  xercesc_4_0::XMLString::transcode
            (" x\tyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XMLString::isWSReplaced(tempStr);
  if (cVar3 != '\0') {
    cVar2 = '\0';
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x1657);
  }
  xercesc_4_0::XMLString::transcode
            (" xyz\n",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XMLString::isWSReplaced(tempStr);
  if (cVar3 != '\0') {
    cVar2 = '\0';
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x1659);
  }
  xercesc_4_0::XMLString::transcode
            ("\rxyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XMLString::isWSReplaced(tempStr);
  if (cVar3 != '\0') {
    cVar2 = '\0';
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x165b);
  }
  xercesc_4_0::XMLString::transcode
            (" x yz ",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            (" x yz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::replaceWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x1661);
  }
  xercesc_4_0::XMLString::transcode
            (" x\tyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::replaceWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x1664);
  }
  xercesc_4_0::XMLString::transcode
            (" x yz\n",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::replaceWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x1667);
  }
  xercesc_4_0::XMLString::transcode
            ("\rx yz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::replaceWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x166a);
  }
  xercesc_4_0::XMLString::transcode
            (" xyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if (cVar3 != '\0') {
    cVar2 = '\0';
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x166e);
  }
  xercesc_4_0::XMLString::transcode
            (" x\tyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if (cVar3 != '\0') {
    cVar2 = '\0';
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x1670);
  }
  xercesc_4_0::XMLString::transcode
            (" xyz\n",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if (cVar3 != '\0') {
    cVar2 = '\0';
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x1672);
  }
  xercesc_4_0::XMLString::transcode
            ("\rxyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if (cVar3 != '\0') {
    cVar2 = '\0';
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x1674);
  }
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if (cVar3 == '\0') {
    cVar2 = '\0';
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x1676);
  }
  xercesc_4_0::XMLString::transcode
            ("x yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if (cVar3 == '\0') {
    cVar2 = '\0';
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x1678);
  }
  xercesc_4_0::XMLString::transcode
            ("x  yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if (cVar3 != '\0') {
    cVar2 = '\0';
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x167a);
  }
  xercesc_4_0::XMLString::transcode
            ("x yz",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            (" x\tyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x1680);
  }
  xercesc_4_0::XMLString::transcode
            ("x yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x1683);
  }
  xercesc_4_0::XMLString::transcode
            ("x  yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x1686);
  }
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            (" xyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x168b);
  }
  xercesc_4_0::XMLString::transcode
            (" xyz\n",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x168e);
  }
  xercesc_4_0::XMLString::transcode
            ("\rxyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x1691);
  }
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x1694);
  }
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            (" x\tyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x169a);
  }
  xercesc_4_0::XMLString::transcode
            ("x yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x169d);
  }
  xercesc_4_0::XMLString::transcode
            ("x  yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x16a0);
  }
  xercesc_4_0::XMLString::transcode
            (" xyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x16a3);
  }
  xercesc_4_0::XMLString::transcode
            (" xyz\n",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x16a6);
  }
  xercesc_4_0::XMLString::transcode
            ("\rxyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x16a9);
  }
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar4 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"String expression test failed at line %i\n",0x16ac);
  }
  XVar7 = xercesc_4_0::XMLString::stringLen((XMLCh *)&xercesc_4_0::XMLUni::fgZeroLenString);
  if (XVar7 != 0) {
    cVar2 = '\0';
    fprintf(_stderr,"strLen test failed at line %i\n",0x16b5);
  }
  one[0] = L'A';
  one[1] = L'\0';
  XVar7 = xercesc_4_0::XMLString::stringLen(one);
  if (XVar7 != 1) {
    cVar2 = '\0';
    fprintf(_stderr,"strLen test failed at line %i\n",0x16bb);
  }
  two[2] = L'\0';
  two[0] = L'A';
  two[1] = L'B';
  XVar7 = xercesc_4_0::XMLString::stringLen(two);
  if (XVar7 != 2) {
    cVar2 = '\0';
    fprintf(_stderr,"strLen test failed at line %i\n",0x16c1);
  }
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XMLString::copyNString(buffer,tempStr,100);
  if (cVar3 == '\0') {
    cVar2 = '\0';
    fprintf(_stderr,"copyNString test failed at line %i\n",0x16ca);
  }
  cVar3 = xercesc_4_0::XMLString::copyNString(buffer,tempStr,3);
  if (cVar3 == '\0') {
    cVar2 = '\0';
    fprintf(_stderr,"copyNString test failed at line %i\n",0x16cf);
  }
  cVar3 = xercesc_4_0::XMLString::copyNString(buffer,tempStr,2);
  if (cVar3 != '\0') {
    cVar2 = '\0';
    fprintf(_stderr,"copyNString test failed at line %i\n",0x16d4);
  }
  cVar3 = xercesc_4_0::XMLString::copyNString(buffer,tempStr,4);
  if (cVar3 == '\0') {
    cVar2 = '\0';
    fprintf(_stderr,"copyNString test failed at line %i\n",0x16d9);
  }
  xercesc_4_0::XMLString::transcode
            ("1234567890",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  iVar5 = xercesc_4_0::XMLString::indexOf(tempStr,L'1');
  if (iVar5 != 0) {
    cVar2 = '\0';
    fprintf(_stderr,"indexOf test failed at line %i\n",0x16e1);
  }
  iVar5 = xercesc_4_0::XMLString::indexOf(tempStr,L'5');
  if (iVar5 != 4) {
    cVar2 = '\0';
    fprintf(_stderr,"indexOf test failed at line %i\n",0x16e6);
  }
  iVar5 = xercesc_4_0::XMLString::indexOf(tempStr,L'0');
  if (iVar5 != 9) {
    cVar2 = '\0';
    fprintf(_stderr,"indexOf test failed at line %i\n",0x16eb);
  }
  iVar5 = xercesc_4_0::XMLString::indexOf(tempStr,L'A');
  if (iVar5 != -1) {
    cVar2 = '\0';
    fprintf(_stderr,"indexOf test failed at line %i\n",0x16f0);
  }
  xercesc_4_0::XMLString::transcode
            ("1234567890",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  iVar5 = xercesc_4_0::XMLString::lastIndexOf(tempStr,L'1');
  if (iVar5 != 0) {
    cVar2 = '\0';
    fprintf(_stderr,"lastIndexOf test failed at line %i\n",0x16f8);
  }
  iVar5 = xercesc_4_0::XMLString::lastIndexOf(tempStr,L'5');
  if (iVar5 != 4) {
    cVar2 = '\0';
    fprintf(_stderr,"lastIndexOf test failed at line %i\n",0x16fd);
  }
  iVar5 = xercesc_4_0::XMLString::lastIndexOf(tempStr,L'0');
  if (iVar5 != 9) {
    cVar2 = '\0';
    fprintf(_stderr,"lastIndexOf test failed at line %i\n",0x1702);
  }
  iVar5 = xercesc_4_0::XMLString::lastIndexOf(tempStr,L'A');
  if (iVar5 != -1) {
    cVar2 = '\0';
    fprintf(_stderr,"lastIndexOf test failed at line %i\n",0x1707);
  }
  xercesc_4_0::CMStateSet::CMStateSet(&setT,0x3c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::CMStateSet::setBit(&setT,8);
  xercesc_4_0::CMStateSet::setBit(&setT,0x34);
  xercesc_4_0::CMStateSet::setBit(&setT,0x22);
  bVar4 = xercesc_4_0::CMStateSet::getBit(&setT,8);
  if (bVar4) {
    bVar4 = xercesc_4_0::CMStateSet::getBit(&setT,0x34);
    if (!bVar4) goto LAB_0011aed3;
    bVar4 = xercesc_4_0::CMStateSet::getBit(&setT,0x22);
    if (!bVar4) goto LAB_0011aed3;
  }
  else {
LAB_0011aed3:
    cVar2 = '\0';
    fprintf(_stderr,"bitset test failed at line %i\n",0x1713);
  }
  xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator(&enumT,&setT,0);
  if (enumT.fLastValue == 0) {
LAB_0011af1b:
    cVar2 = '\0';
    fprintf(_stderr,"bitset test failed at line %i\n",0x171a);
  }
  else {
    uVar6 = xercesc_4_0::CMStateSetEnumerator::nextElement(&enumT);
    if (uVar6 != 8) goto LAB_0011af1b;
  }
  if (enumT.fLastValue == 0) {
LAB_0011af3f:
    cVar2 = '\0';
    fprintf(_stderr,"bitset test failed at line %i\n",0x171f);
  }
  else {
    uVar6 = xercesc_4_0::CMStateSetEnumerator::nextElement(&enumT);
    if (uVar6 != 0x22) goto LAB_0011af3f;
  }
  if (enumT.fLastValue == 0) {
LAB_0011af63:
    cVar2 = '\0';
    fprintf(_stderr,"bitset test failed at line %i\n",0x1724);
  }
  else {
    uVar6 = xercesc_4_0::CMStateSetEnumerator::nextElement(&enumT);
    if (uVar6 != 0x34) goto LAB_0011af63;
  }
  if (enumT.fLastValue != 0) {
    cVar2 = '\0';
    fprintf(_stderr,"bitset test failed at line %i\n",0x1729);
  }
  xercesc_4_0::CMStateSet::CMStateSet(&setT2,0xc00,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::CMStateSet::setBit(&setT2,0);
  xercesc_4_0::CMStateSet::setBit(&setT2,0x1ff);
  xercesc_4_0::CMStateSet::setBit(&setT2,0x200);
  xercesc_4_0::CMStateSet::setBit(&setT2,0x201);
  xercesc_4_0::CMStateSet::setBit(&setT2,0x3ff);
  xercesc_4_0::CMStateSet::setBit(&setT2,0x800);
  xercesc_4_0::CMStateSet::setBit(&setT2,0x9ff);
  xercesc_4_0::CMStateSet::setBit(&setT2,0xa00);
  xercesc_4_0::CMStateSet::setBit(&setT2,0xa01);
  xercesc_4_0::CMStateSet::setBit(&setT2,0xbff);
  bVar4 = xercesc_4_0::CMStateSet::getBit(&setT2,0);
  if (bVar4) {
    bVar4 = xercesc_4_0::CMStateSet::getBit(&setT2,0x3ff);
    if (!bVar4) goto LAB_0011aef7;
    bVar4 = xercesc_4_0::CMStateSet::getBit(&setT2,0xa01);
    if (!bVar4) goto LAB_0011aef7;
  }
  else {
LAB_0011aef7:
    cVar2 = '\0';
    fprintf(_stderr,"bitset test failed at line %i\n",0x173d);
  }
  XVar7 = xercesc_4_0::CMStateSet::getBitCountInRange(&setT2,0,0xc00);
  if (XVar7 != 10) {
    cVar2 = '\0';
    fprintf(_stderr,"bitset test failed at line %i\n",0x1743);
  }
  xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator(&enumT2,&setT2,0);
  lVar12 = 10;
  while (enumT2.fLastValue != 0) {
    xercesc_4_0::CMStateSetEnumerator::nextElement(&enumT2);
    lVar12 = lVar12 + -1;
  }
  if (lVar12 != 0) {
    cVar2 = '\0';
    fprintf(_stderr,"bitset test failed at line %i\n",0x174f);
  }
  xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator(&enumT2a,&setT2,0x200);
  if (enumT2a.fLastValue == 0) {
LAB_0011af87:
    cVar2 = '\0';
    fprintf(_stderr,"bitset test failed at line %i\n",0x1757);
  }
  else {
    uVar6 = xercesc_4_0::CMStateSetEnumerator::nextElement(&enumT2a);
    if (uVar6 != 0x200) goto LAB_0011af87;
  }
  xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator(&enumT2b,&setT2,0x202);
  if (enumT2b.fLastValue == 0) {
LAB_0011afab:
    cVar2 = '\0';
    fprintf(_stderr,"bitset test failed at line %i\n",0x175d);
  }
  else {
    uVar6 = xercesc_4_0::CMStateSetEnumerator::nextElement(&enumT2b);
    if (uVar6 != 0x3ff) goto LAB_0011afab;
  }
  xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator(&enumT2c,&setT2,0x800);
  if (enumT2c.fLastValue != 0) {
    uVar6 = xercesc_4_0::CMStateSetEnumerator::nextElement(&enumT2c);
    if (uVar6 == 0x800) goto LAB_0011aa5b;
  }
  cVar2 = '\0';
  fprintf(_stderr,"bitset test failed at line %i\n",0x1763);
LAB_0011aa5b:
  xercesc_4_0::CMStateSet::CMStateSet(&setT3,0xc00,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::CMStateSet::CMStateSet(&setT4,0xc00,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::CMStateSet::setBit(&setT3,0);
  xercesc_4_0::CMStateSet::setBit(&setT4,0x400);
  XVar7 = xercesc_4_0::CMStateSet::hashCode(&setT3);
  XVar8 = xercesc_4_0::CMStateSet::hashCode(&setT4);
  if (XVar7 == XVar8) {
    cVar2 = '\0';
    fprintf(_stderr,"bitset test failed at line %i\n",0x176e);
  }
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            (local_2a0,(wchar16 *)&xercesc_4_0::XMLUni::fgZeroLenString,"UTF-8",
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar9 = xercesc_4_0::TranscodeToStr::adopt(local_2a0);
  xercesc_4_0::TranscodeToStr::~TranscodeToStr(local_2a0);
  empty = (char *)pXVar9;
  lVar12 = xercesc_4_0::XMLString::stringLen((char *)pXVar9);
  if (lVar12 != 0) {
    cVar2 = '\0';
    fprintf(_stderr,"TranscodeToStr failed at line %i\n",0x1778);
  }
  pcVar1 = empty;
  sVar10 = strlen(empty);
  xercesc_4_0::TranscodeFromStr::TranscodeFromStr
            ((TranscodeFromStr *)local_2a0,(uchar *)pcVar1,sVar10,"UTF-8",
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar11 = xercesc_4_0::TranscodeFromStr::adopt((TranscodeFromStr *)local_2a0);
  xercesc_4_0::TranscodeFromStr::~TranscodeFromStr((TranscodeFromStr *)local_2a0);
  empty2 = pXVar11;
  XVar7 = xercesc_4_0::XMLString::stringLen(pXVar11);
  if (XVar7 != 0) {
    cVar2 = '\0';
    fprintf(_stderr,"TranscodeFromStr failed at line %i\n",0x177e);
  }
  xercesc_4_0::XMLString::release(&empty,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&empty2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  aval[0] = L'A';
  aval[1] = L'\0';
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            (local_2a0,aval,"UTF-8",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar9 = xercesc_4_0::TranscodeToStr::adopt(local_2a0);
  xercesc_4_0::TranscodeToStr::~TranscodeToStr(local_2a0);
  ac = (char *)pXVar9;
  bVar4 = xercesc_4_0::XMLString::equals((char *)pXVar9,"A");
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"TranscodeToStr failed at line %i\n",0x1788);
  }
  pcVar1 = ac;
  sVar10 = strlen(ac);
  xercesc_4_0::TranscodeFromStr::TranscodeFromStr
            ((TranscodeFromStr *)local_2a0,(uchar *)pcVar1,sVar10,"UTF-8",
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar11 = xercesc_4_0::TranscodeFromStr::adopt((TranscodeFromStr *)local_2a0);
  xercesc_4_0::TranscodeFromStr::~TranscodeFromStr((TranscodeFromStr *)local_2a0);
  ac2 = pXVar11;
  bVar4 = xercesc_4_0::XMLString::equals(pXVar11,aval);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"TranscodeFromStr failed at line %i\n",0x178e);
  }
  xercesc_4_0::XMLString::release(&ac,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&ac2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uval[0] = L'╋';
  uval[1] = L'\0';
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            (local_2a0,uval,"UTF-8",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar9 = xercesc_4_0::TranscodeToStr::adopt(local_2a0);
  xercesc_4_0::TranscodeToStr::~TranscodeToStr(local_2a0);
  uc = (char *)pXVar9;
  bVar4 = xercesc_4_0::XMLString::equals((char *)pXVar9,anon_var_dwarf_476e);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"TranscodeToStr failed at line %i\n",0x1797);
  }
  pcVar1 = uc;
  sVar10 = strlen(uc);
  xercesc_4_0::TranscodeFromStr::TranscodeFromStr
            ((TranscodeFromStr *)local_2a0,(uchar *)pcVar1,sVar10,"UTF-8",
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar11 = xercesc_4_0::TranscodeFromStr::adopt((TranscodeFromStr *)local_2a0);
  xercesc_4_0::TranscodeFromStr::~TranscodeFromStr((TranscodeFromStr *)local_2a0);
  uc2 = pXVar11;
  bVar4 = xercesc_4_0::XMLString::equals(pXVar11,uval);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"TranscodeFromStr failed at line %i\n",0x179d);
  }
  xercesc_4_0::XMLString::release(&uc,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&uc2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uc3[0] = L'步';
  uc3[1] = L'\0';
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            (local_2a0,uc3,"UTF-8",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar9 = xercesc_4_0::TranscodeToStr::adopt(local_2a0);
  xercesc_4_0::TranscodeToStr::~TranscodeToStr(local_2a0);
  uc4 = (char *)pXVar9;
  bVar4 = xercesc_4_0::XMLString::equals((char *)pXVar9,anon_var_dwarf_477a);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"TranscodeToStr failed at line %i\n",0x17a7);
  }
  xercesc_4_0::XMLString::release(&uc4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  builtin_memcpy(xmlStr,L"絞り込み検索",0xe);
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            (local_2a0,xmlStr,"UTF-8",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar9 = xercesc_4_0::TranscodeToStr::adopt(local_2a0);
  xercesc_4_0::TranscodeToStr::~TranscodeToStr(local_2a0);
  bytes = (char *)pXVar9;
  bVar4 = xercesc_4_0::XMLString::equals((char *)pXVar9,anon_var_dwarf_4786);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"TranscodeToStr failed at line %i\n",0x17b2);
  }
  xercesc_4_0::XMLString::release(&bytes,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  builtin_memcpy(xmlStr2,L"中国制造 / 中國製造",0x18);
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            (local_2a0,xmlStr2,"UTF-8",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar9 = xercesc_4_0::TranscodeToStr::adopt(local_2a0);
  xercesc_4_0::TranscodeToStr::~TranscodeToStr(local_2a0);
  bytes2 = (char *)pXVar9;
  bVar4 = xercesc_4_0::XMLString::equals((char *)pXVar9,anon_var_dwarf_479e);
  if (!bVar4) {
    cVar2 = '\0';
    fprintf(_stderr,"TranscodeToStr failed at line %i\n",0x17be);
  }
  xercesc_4_0::XMLString::release(&bytes2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::CMStateSet::~CMStateSet(&setT4);
  xercesc_4_0::CMStateSet::~CMStateSet(&setT3);
  xercesc_4_0::CMStateSet::~CMStateSet(&setT2);
  xercesc_4_0::CMStateSet::~CMStateSet(&setT);
  return (bool)cVar2;
}

Assistant:

bool DOMTest::testUtilFunctions()
{
    bool OK = true;
    // test isWSReplaced
    XMLString::transcode(" xyz ", tempStr, 3999);
    TEST_BOOLEAN(XMLString::isWSReplaced(tempStr));
    XMLString::transcode(" x\tyz ", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSReplaced(tempStr));
    XMLString::transcode(" xyz\n", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSReplaced(tempStr));
    XMLString::transcode("\rxyz", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSReplaced(tempStr));

    // test replaceWS
    XMLString::transcode(" x yz ", tempStr2, 3999);
    XMLString::transcode(" x yz ", tempStr, 3999);
    XMLString::replaceWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode(" x\tyz ", tempStr, 3999);
    XMLString::replaceWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode(" x yz\n", tempStr, 3999);
    XMLString::replaceWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("\rx yz ", tempStr, 3999);
    XMLString::replaceWS(tempStr);
    TEST_STRING(tempStr, tempStr2);

    // test isWSCollapsed
    XMLString::transcode(" xyz ", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSCollapsed(tempStr));
    XMLString::transcode(" x\tyz ", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSCollapsed(tempStr));
    XMLString::transcode(" xyz\n", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSCollapsed(tempStr));
    XMLString::transcode("\rxyz", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSCollapsed(tempStr));
    XMLString::transcode("xyz", tempStr, 3999);
    TEST_BOOLEAN(XMLString::isWSCollapsed(tempStr));
    XMLString::transcode("x yz", tempStr, 3999);
    TEST_BOOLEAN(XMLString::isWSCollapsed(tempStr));
    XMLString::transcode("x  yz", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSCollapsed(tempStr));

    // test collapseWS
    XMLString::transcode("x yz", tempStr2, 3999);
    XMLString::transcode(" x\tyz ", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("x yz", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("x  yz", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);

    XMLString::transcode("xyz", tempStr2, 3999);
    XMLString::transcode(" xyz ", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode(" xyz\n", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("\rxyz", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("xyz", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);

    // test removeWS
    XMLString::transcode("xyz", tempStr2, 3999);
    XMLString::transcode(" x\tyz ", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("x yz", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("x  yz", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode(" xyz ", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode(" xyz\n", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("\rxyz", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("xyz", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);

    if(XMLString::stringLen((XMLCh*)0)!=0)
    {
        fprintf(stderr, "strLen test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::stringLen(XMLUni::fgZeroLenString)!=0)
    {
        fprintf(stderr, "strLen test failed at line %i\n", __LINE__);
        OK = false;
    }
    XMLCh one[2]={ chLatin_A, chNull };
    if(XMLString::stringLen(one)!=1)
    {
        fprintf(stderr, "strLen test failed at line %i\n", __LINE__);
        OK = false;
    }
    XMLCh two[3]={ chLatin_A, chLatin_B, chNull };
    if(XMLString::stringLen(two)!=2)
    {
        fprintf(stderr, "strLen test failed at line %i\n", __LINE__);
        OK = false;
    }

    // test copyNString
    XMLCh buffer[100];
    XMLString::transcode("xyz", tempStr, 3999);
    if(!XMLString::copyNString(buffer, tempStr, 100))
    {
        fprintf(stderr, "copyNString test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(!XMLString::copyNString(buffer, tempStr, 3))
    {
        fprintf(stderr, "copyNString test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::copyNString(buffer, tempStr, 2))
    {
        fprintf(stderr, "copyNString test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(!XMLString::copyNString(buffer, tempStr, 4))
    {
        fprintf(stderr, "copyNString test failed at line %i\n", __LINE__);
        OK = false;
    }

    // test indexOf
    XMLString::transcode("1234567890", tempStr, 3999);
    if(XMLString::indexOf(tempStr, '1')!=0)
    {
        fprintf(stderr, "indexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::indexOf(tempStr, '5')!=4)
    {
        fprintf(stderr, "indexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::indexOf(tempStr, '0')!=9)
    {
        fprintf(stderr, "indexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::indexOf(tempStr, 'A')!=-1)
    {
        fprintf(stderr, "indexOf test failed at line %i\n", __LINE__);
        OK = false;
    }

    // test lastIndexOf
    XMLString::transcode("1234567890", tempStr, 3999);
    if(XMLString::lastIndexOf(tempStr, '1')!=0)
    {
        fprintf(stderr, "lastIndexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::lastIndexOf(tempStr, '5')!=4)
    {
        fprintf(stderr, "lastIndexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::lastIndexOf(tempStr, '0')!=9)
    {
        fprintf(stderr, "lastIndexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::lastIndexOf(tempStr, 'A')!=-1)
    {
        fprintf(stderr, "lastIndexOf test failed at line %i\n", __LINE__);
        OK = false;
    }

    // this tests the cached bit storage
    CMStateSet setT(60);
    setT.setBit(8);
    setT.setBit(52);
    setT.setBit(34);

    if(!setT.getBit(8) || !setT.getBit(52) || !setT.getBit(34))
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

    CMStateSetEnumerator enumT(&setT);
    if(!enumT.hasMoreElements() || enumT.nextElement()!=8)
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(!enumT.hasMoreElements() || enumT.nextElement()!=34)
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(!enumT.hasMoreElements() || enumT.nextElement()!=52)
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(enumT.hasMoreElements())
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

    // this tests the dynamic bit storage
    CMStateSet setT2(3 * CMSTATE_BITFIELD_CHUNK);
    setT2.setBit(0); // first block, begin
    setT2.setBit(CMSTATE_BITFIELD_CHUNK/2 -1); // first block, middle
    setT2.setBit(CMSTATE_BITFIELD_CHUNK/2); // first block, middle
    setT2.setBit(CMSTATE_BITFIELD_CHUNK/2 +1); // first block, middle
    setT2.setBit(CMSTATE_BITFIELD_CHUNK-1); // first block, end
    setT2.setBit(2*CMSTATE_BITFIELD_CHUNK); // last block, begin
    setT2.setBit(2*CMSTATE_BITFIELD_CHUNK + CMSTATE_BITFIELD_CHUNK/2 -1); // last block, middle
    setT2.setBit(2*CMSTATE_BITFIELD_CHUNK + CMSTATE_BITFIELD_CHUNK/2); // last block, middle
    setT2.setBit(2*CMSTATE_BITFIELD_CHUNK + CMSTATE_BITFIELD_CHUNK/2 +1); // last block, middle
    setT2.setBit(3*CMSTATE_BITFIELD_CHUNK-1); // last block, end

    // test just a few ones
    if(!setT2.getBit(0) || !setT2.getBit(CMSTATE_BITFIELD_CHUNK-1) || !setT2.getBit(2*CMSTATE_BITFIELD_CHUNK + CMSTATE_BITFIELD_CHUNK/2 +1))
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

    if(setT2.getBitCountInRange(0, 3*CMSTATE_BITFIELD_CHUNK)!=10)
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    CMStateSetEnumerator enumT2(&setT2);
    XMLSize_t count=0;
    while(enumT2.hasMoreElements())
    {
        count++;
        enumT2.nextElement();
    }
    if(count!=10)
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

    // test the enumerator with a non-default start
    CMStateSetEnumerator enumT2a(&setT2, CMSTATE_BITFIELD_CHUNK/2);
    if(!enumT2a.hasMoreElements() || enumT2a.nextElement()!= (CMSTATE_BITFIELD_CHUNK/2))
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    CMStateSetEnumerator enumT2b(&setT2, CMSTATE_BITFIELD_CHUNK/2+2);
    if(!enumT2b.hasMoreElements() || enumT2b.nextElement()!= (CMSTATE_BITFIELD_CHUNK-1))
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    CMStateSetEnumerator enumT2c(&setT2, 2*CMSTATE_BITFIELD_CHUNK);
    if(!enumT2c.hasMoreElements() || enumT2c.nextElement()!= (2*CMSTATE_BITFIELD_CHUNK))
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

    // this tests the hash generator
    CMStateSet setT3(3 * CMSTATE_BITFIELD_CHUNK), setT4(3 * CMSTATE_BITFIELD_CHUNK);
    // these two sets will have a single bit set at the beginning of a chunk
    setT3.setBit(0);
    setT4.setBit(CMSTATE_BITFIELD_CHUNK);
    if(setT3.hashCode()==setT4.hashCode())
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

	// TranscodeFrom/ToStr

	const char* utf8 = "UTF-8";
	char* empty = (char*)TranscodeToStr(XMLUni::fgZeroLenString,utf8).adopt(); 
	if(XMLString::stringLen(empty)!=0)
	{
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLCh* empty2 = TranscodeFromStr((XMLByte*)empty,strlen(empty),utf8).adopt(); 
	if(XMLString::stringLen(empty2)!=0)
	{
        fprintf(stderr, "TranscodeFromStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLString::release(&empty);
	XMLString::release(&empty2);

	const XMLCh aval [] = { 0x0041, 0x0000}; //LATIN CAPITAL LETTER A
	char* ac = (char*)TranscodeToStr(aval,utf8).adopt(); 
	if(!XMLString::equals(ac, "A"))
	{
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLCh* ac2=TranscodeFromStr((XMLByte*)ac, strlen(ac), utf8).adopt();
	if(!XMLString::equals(ac2, aval))
	{
        fprintf(stderr, "TranscodeFromStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLString::release(&ac);
	XMLString::release(&ac2);
	const XMLCh uval [] = { 0x254B, 0x0000}; //BOX DRAWINGS HEAVY VERTICAL AND HORIZONTAL (needs 3 bytes for utf-8)
	char* uc = (char*)TranscodeToStr(uval,utf8).adopt(); 
	if(!XMLString::equals(uc, "\xE2\x95\x8B"))
	{
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLCh* uc2=TranscodeFromStr((XMLByte*)uc, strlen(uc), utf8).adopt();
	if(!XMLString::equals(uc2, uval))
	{
        fprintf(stderr, "TranscodeFromStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLString::release(&uc);
	XMLString::release(&uc2);

	XMLCh uc3[] = { 0x6B65, 0 }; // Unicode Han Character 'step, pace; walk, stroll' (U+6B65); UTF-8 = 0xE6 0xAD 0xA5 (e6ada5)
	char* uc4 = (char*)TranscodeToStr(uc3, utf8).adopt();
	if(!XMLString::equals(uc4, "\xE6\xAD\xA5"))
	{
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLString::release(&uc4);

	// Input:                    U+7D5E U+308A U+8FBC U+307F U+691C U+7D22
	// Expected byte sequence:   E7 B5 9E E3 82 8A E8 BE BC E3 81 BF E6 A4 9C E7 B4 A2
	const XMLCh xmlStr [] = { 0x7D5E, 0x308A, 0x8FBC, 0x307F, 0x691C, 0x7D22, 0x0000};
	char* bytes = (char*)TranscodeToStr(xmlStr, "UTF-8").adopt();
	if(!XMLString::equals(bytes, "\xE7\xB5\x9E\xE3\x82\x8A\xE8\xBE\xBC\xE3\x81\xBF\xE6\xA4\x9C\xE7\xB4\xA2"))
	{
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLString::release(&bytes);

    // XERCESC-2052
    // Input:                    U+4E2D U+56FD U+5236 U+9020 U+4E2D U+570B U+88FD U+9020
    // Expected byte sequence:   E4 B8 AD E5 9B BD E5 88 B6 E9 80 A0 20 2F 20 E4 B8 AD E5 9C 8B E8 A3 BD E9 80 A0
    const XMLCh xmlStr2[] = { 0x4E2D, 0x56FD, 0x5236, 0x9020, 0x20, 0x2F, 0x20, 0x4E2D, 0x570B, 0x88FD, 0x9020, 0x0000 };
    char* bytes2 = (char*)TranscodeToStr(xmlStr2, "UTF-8").adopt();
    if (!XMLString::equals(bytes2, "\xE4\xB8\xAD\xE5\x9B\xBD\xE5\x88\xB6\xE9\x80\xA0\x20\x2F\x20\xE4\xB8\xAD\xE5\x9C\x8B\xE8\xA3\xBD\xE9\x80\xA0"))
    {
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
    }
    XMLString::release(&bytes2);

    return OK;
}